

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O1

_Bool roaring_bitmap_remove_checked(roaring_bitmap_t *r,uint32_t val)

{
  ushort uVar1;
  uint16_t *puVar2;
  uint8_t *puVar3;
  bool bVar4;
  uint8_t uVar5;
  uint8_t uVar6;
  undefined4 in_EAX;
  shared_container_t *sc;
  run_container_t *prVar7;
  long lVar8;
  ushort uVar9;
  long lVar10;
  uint uVar11;
  int iVar12;
  ulong uVar13;
  int iVar14;
  run_container_t *prVar15;
  uint in_R10D;
  uint uVar16;
  int32_t iVar17;
  _Bool _Var18;
  uint8_t newtypecode;
  undefined4 uStack_38;
  uint local_34;
  
  iVar12 = (r->high_low_container).size;
  if ((long)iVar12 == 0) {
LAB_0011450f:
    uVar16 = iVar12 - 1;
  }
  else {
    puVar2 = (r->high_low_container).keys;
    uVar9 = (ushort)(val >> 0x10);
    if (puVar2[(long)iVar12 + -1] == uVar9) goto LAB_0011450f;
    iVar14 = iVar12 + -1;
    uVar11 = 0;
    do {
      if (iVar14 < (int)uVar11) {
        uVar16 = ~uVar11;
        break;
      }
      uVar16 = uVar11 + iVar14 >> 1;
      uVar1 = *(ushort *)((long)puVar2 + (ulong)(uVar11 + iVar14 & 0xfffffffe));
      if (uVar1 < uVar9) {
        uVar11 = uVar16 + 1;
        bVar4 = true;
        uVar16 = in_R10D;
      }
      else if (uVar9 < uVar1) {
        iVar14 = uVar16 - 1;
        bVar4 = true;
        uVar16 = in_R10D;
      }
      else {
        bVar4 = false;
      }
      in_R10D = uVar16;
    } while (bVar4);
  }
  if ((int)uVar16 < 0) {
    _Var18 = false;
  }
  else {
    if (iVar12 <= (int)(uVar16 & 0xffff)) {
      __assert_fail("i < ra->size",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                    ,0x1a95,"void ra_unshare_container_at_index(roaring_array_t *, uint16_t)");
    }
    uVar11 = uVar16 & 0xffff;
    puVar3 = (r->high_low_container).typecodes;
    sc = (shared_container_t *)(r->high_low_container).containers[uVar11];
    _uStack_38 = CONCAT44(uVar16,in_EAX);
    if (puVar3[uVar11] == '\x04') {
      sc = (shared_container_t *)shared_container_extract_copy(sc,puVar3 + uVar11);
    }
    *(shared_container_t **)((long)(r->high_low_container).containers + (ulong)(uVar11 * 8)) = sc;
    uVar6 = (r->high_low_container).typecodes[uVar11];
    prVar15 = *(run_container_t **)((long)(r->high_low_container).containers + (ulong)(uVar11 * 8));
    prVar7 = prVar15;
    uVar5 = uVar6;
    if (uVar6 == '\x04') {
      uVar5 = *(uint8_t *)&prVar15->runs;
      if (uVar5 == '\x04') goto LAB_001147b7;
      prVar7 = *(run_container_t **)prVar15;
    }
    if (uVar5 == '\x03') {
      lVar8 = cpuid_Extended_Feature_Enumeration_info(7);
      if ((*(uint *)(lVar8 + 4) & 0x20) == 0) {
        iVar17 = prVar7->n_runs;
        lVar8 = (long)iVar17;
        if (0 < lVar8) {
          lVar10 = 0;
          do {
            iVar17 = iVar17 + (uint)prVar7->runs[lVar10].length;
            lVar10 = lVar10 + 1;
          } while (lVar8 != lVar10);
        }
      }
      else {
        iVar17 = _avx2_run_container_cardinality(prVar7);
      }
    }
    else {
      if ((uVar5 != '\x02') && (uVar5 != '\x01')) goto LAB_001147d6;
      iVar17 = prVar7->n_runs;
    }
    uStack_38 = CONCAT13(uVar6,(undefined3)uStack_38);
    prVar7 = (run_container_t *)
             container_remove(prVar15,(uint16_t)val,uVar6,(uint8_t *)((long)&uStack_38 + 3));
    uVar13 = (ulong)local_34;
    if (prVar7 != prVar15) {
      container_free(prVar15,uVar6);
      if ((r->high_low_container).size <= (int)local_34) goto LAB_00114779;
      (r->high_low_container).containers[uVar13] = prVar7;
      (r->high_low_container).typecodes[uVar13] = uStack_38._3_1_;
    }
    uVar5 = uStack_38._3_1_;
    prVar15 = prVar7;
    uVar6 = uStack_38._3_1_;
    if (uStack_38._3_1_ == '\x04') {
      uVar6 = *(uint8_t *)&prVar7->runs;
      if (uVar6 == '\x04') {
LAB_001147b7:
        __assert_fail("*type != SHARED_CONTAINER_TYPE",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                      ,0x1062,
                      "const container_t *container_unwrap_shared(const container_t *, uint8_t *)");
      }
      prVar15 = *(run_container_t **)prVar7;
    }
    uVar16 = local_34;
    if (uVar6 == '\x03') {
      lVar8 = cpuid_Extended_Feature_Enumeration_info(7);
      if ((*(uint *)(lVar8 + 4) & 0x20) == 0) {
        iVar12 = prVar15->n_runs;
        lVar8 = (long)iVar12;
        if (0 < lVar8) {
          lVar10 = 0;
          do {
            iVar12 = iVar12 + (uint)prVar15->runs[lVar10].length;
            lVar10 = lVar10 + 1;
          } while (lVar8 != lVar10);
        }
      }
      else {
        iVar12 = _avx2_run_container_cardinality(prVar15);
        uVar16 = local_34;
      }
    }
    else {
      if ((uVar6 != '\x02') && (uVar6 != '\x01')) {
LAB_001147d6:
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                      ,0x10fa,"int container_get_cardinality(const container_t *, uint8_t)");
      }
      iVar12 = prVar15->n_runs;
    }
    if (iVar12 == 0) {
      container_free((r->high_low_container).containers[uVar13],
                     (r->high_low_container).typecodes[uVar13]);
      ra_remove_at_index(&r->high_low_container,uVar16);
    }
    else {
      if ((r->high_low_container).size <= (int)uVar16) {
LAB_00114779:
        __assert_fail("i < ra->size",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                      ,0x1a3a,
                      "void ra_set_container_at_index(const roaring_array_t *, int32_t, container_t *, uint8_t)"
                     );
      }
      (r->high_low_container).containers[uVar13] = prVar7;
      (r->high_low_container).typecodes[uVar13] = uVar5;
    }
    _Var18 = iVar17 != iVar12;
  }
  return _Var18;
}

Assistant:

bool roaring_bitmap_remove_checked(roaring_bitmap_t *r, uint32_t val) {
    const uint16_t hb = val >> 16;
    const int i = ra_get_index(&r->high_low_container, hb);
    uint8_t typecode;
    bool result = false;
    if (i >= 0) {
        ra_unshare_container_at_index(&r->high_low_container, i);
        container_t *container =
            ra_get_container_at_index(&r->high_low_container, i, &typecode);

        const int oldCardinality =
            container_get_cardinality(container, typecode);

        uint8_t newtypecode = typecode;
        container_t *container2 =
            container_remove(container, val & 0xFFFF, typecode, &newtypecode);
        if (container2 != container) {
            container_free(container, typecode);
            ra_set_container_at_index(&r->high_low_container, i, container2,
                                      newtypecode);
        }

        const int newCardinality =
            container_get_cardinality(container2, newtypecode);

        if (newCardinality != 0) {
            ra_set_container_at_index(&r->high_low_container, i, container2,
                                      newtypecode);
        } else {
            ra_remove_at_index_and_free(&r->high_low_container, i);
        }

        result = oldCardinality != newCardinality;
    }
    return result;
}